

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform_posix.h
# Opt level: O2

char * FormatPackagePath(KonohaContext *kctx,char *buf,size_t bufsiz,char *packageName,char *ext)

{
  kbool_t kVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  
  pcVar2 = (*kctx->platApi->getenv_i)("KONOHA_HOME");
  if (pcVar2 == (char *)0x0) {
    pcVar2 = (*kctx->platApi->getenv_i)("HOME");
    pcVar4 = "/.konoha/package";
  }
  else {
    pcVar4 = "/package";
  }
  pcVar3 = ShortPackageName(packageName);
  snprintf(buf,bufsiz,"%s%s/%s/%s%s",pcVar2,pcVar4,packageName,pcVar3,ext);
  kVar1 = HasFile(buf);
  if (!kVar1) {
    pcVar2 = ShortPackageName(packageName);
    snprintf(buf,bufsiz,"/usr/local/lib/konoha/3.0/package/%s/%s%s",packageName,pcVar2,ext);
  }
  kVar1 = HasFile(buf);
  pcVar2 = (char *)0x0;
  if (kVar1) {
    pcVar2 = buf;
  }
  return pcVar2;
}

Assistant:

static const char* FormatPackagePath(KonohaContext *kctx, char *buf, size_t bufsiz, const char *packageName, const char *ext)
{
	const char *path = PLATAPI getenv_i("KONOHA_HOME");
	const char *local = "/package";
	if(path == NULL) {
		path = PLATAPI getenv_i("HOME");
		local = "/.konoha/package";
	}
	snprintf(buf, bufsiz, "%s%s/%s/%s%s", path, local, packageName, ShortPackageName(packageName), ext);
#ifdef K_PREFIX
	if(!HasFile(buf)) {
		snprintf(buf, bufsiz, K_PREFIX "/lib/konoha/" K_VERSION "/package" "/%s/%s%s", packageName, ShortPackageName(packageName), ext);
	}
#endif
	return HasFile(buf) ? (const char *)buf : NULL;
}